

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int32 *
ma_dr_flac__full_read_and_close_s32
          (ma_dr_flac *pFlac,uint *channelsOut,uint *sampleRateOut,ma_uint64 *totalPCMFrameCountOut)

{
  ma_uint64 mVar1;
  void *szOld;
  ma_uint64 *in_RCX;
  undefined4 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  ma_uint64 dataSize;
  size_t newSampleDataBufferSize;
  ma_int32 *pNewSampleData;
  size_t sampleDataBufferSize;
  ma_uint64 pcmFramesRead;
  ma_int32 buffer [4096];
  ma_uint64 totalPCMFrameCount;
  ma_int32 *pSampleData;
  ma_allocation_callbacks *in_stack_ffffffffffffbf98;
  ma_dr_flac *in_stack_ffffffffffffbfa0;
  ma_int32 *in_stack_ffffffffffffbfb0;
  void *p;
  undefined1 local_4038 [24];
  ma_int32 *in_stack_ffffffffffffbfe0;
  ma_uint64 in_stack_ffffffffffffbfe8;
  ma_dr_flac *in_stack_ffffffffffffbff0;
  ma_uint64 local_38;
  ma_int32 *local_30;
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    p = (void *)0x4000;
    local_30 = (ma_int32 *)
               ma_dr_flac__malloc_from_callbacks
                         ((size_t)in_stack_ffffffffffffbf98,(ma_allocation_callbacks *)0x200285);
    if (local_30 != (ma_int32 *)0x0) {
      local_38 = 0;
      while (mVar1 = ma_dr_flac_read_pcm_frames_s32
                               (in_stack_ffffffffffffbff0,in_stack_ffffffffffffbfe8,
                                in_stack_ffffffffffffbfe0), mVar1 != 0) {
        szOld = p;
        if (p < (void *)((local_38 + mVar1) * (ulong)*(byte *)(in_RDI + 0x34) * 4)) {
          szOld = (void *)((long)p << 1);
          in_stack_ffffffffffffbfb0 =
               (ma_int32 *)
               ma_dr_flac__realloc_from_callbacks
                         (p,(size_t)in_stack_ffffffffffffbfb0,(size_t)szOld,
                          (ma_allocation_callbacks *)in_stack_ffffffffffffbfa0);
          local_30 = in_stack_ffffffffffffbfb0;
          if (in_stack_ffffffffffffbfb0 == (ma_int32 *)0x0) {
            ma_dr_flac__free_from_callbacks(in_stack_ffffffffffffbfa0,in_stack_ffffffffffffbf98);
            goto LAB_00200533;
          }
        }
        memcpy(local_30 + local_38 * *(byte *)(in_RDI + 0x34),local_4038,
               mVar1 * *(byte *)(in_RDI + 0x34) * 4);
        local_38 = mVar1 + local_38;
        p = szOld;
      }
      memset(local_30 + local_38 * *(byte *)(in_RDI + 0x34),0,
             (size_t)((long)p + local_38 * *(byte *)(in_RDI + 0x34) * -4));
LAB_002004b5:
      if (in_RDX != (undefined4 *)0x0) {
        *in_RDX = *(undefined4 *)(in_RDI + 0x30);
      }
      if (in_RSI != (uint *)0x0) {
        *in_RSI = (uint)*(byte *)(in_RDI + 0x34);
      }
      if (in_RCX != (ma_uint64 *)0x0) {
        *in_RCX = local_38;
      }
      ma_dr_flac_close(in_stack_ffffffffffffbfa0);
      return local_30;
    }
  }
  else {
    in_stack_ffffffffffffbfa0 =
         (ma_dr_flac *)(*(long *)(in_RDI + 0x38) * (ulong)*(byte *)(in_RDI + 0x34) * 4);
    local_30 = (ma_int32 *)
               ma_dr_flac__malloc_from_callbacks
                         ((size_t)in_stack_ffffffffffffbf98,(ma_allocation_callbacks *)0x200474);
    if (local_30 != (ma_int32 *)0x0) {
      local_38 = ma_dr_flac_read_pcm_frames_s32
                           (in_stack_ffffffffffffbff0,in_stack_ffffffffffffbfe8,
                            in_stack_ffffffffffffbfe0);
      goto LAB_002004b5;
    }
  }
LAB_00200533:
  ma_dr_flac_close(in_stack_ffffffffffffbfa0);
  return (ma_int32 *)0x0;
}

Assistant:

ma_int32* ma_dr_flac_open_and_read_pcm_frames_s32(ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, void* pUserData, unsigned int* channelsOut, unsigned int* sampleRateOut, ma_uint64* totalPCMFrameCountOut, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    if (channelsOut) {
        *channelsOut = 0;
    }
    if (sampleRateOut) {
        *sampleRateOut = 0;
    }
    if (totalPCMFrameCountOut) {
        *totalPCMFrameCountOut = 0;
    }
    pFlac = ma_dr_flac_open(onRead, onSeek, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    return ma_dr_flac__full_read_and_close_s32(pFlac, channelsOut, sampleRateOut, totalPCMFrameCountOut);
}